

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O2

bool dg::vr::RelationsGraph<dg::vr::ValueRelations>::processEdge
               (RelationEdge *edge,Type strictRel,Relations *updated,bool toFirstStrict,
               Visited *firstStrictEdges)

{
  char cVar1;
  const_iterator cVar2;
  bool bVar3;
  
  cVar1 = dg::vr::Relations::transitiveOver(strictRel,edge->_rel);
  bVar3 = true;
  if (cVar1 != '\0') {
    if (toFirstStrict) {
      bVar3 = ((updated->bits).super__Base_bitset<1UL>._M_w & 1L << ((byte)strictRel & 0x3f)) != 0;
      if (bVar3) {
        cVar2 = std::
                _Rb_tree<dg::vr::Bucket::RelationEdge,_dg::vr::Bucket::RelationEdge,_std::_Identity<dg::vr::Bucket::RelationEdge>,_std::less<dg::vr::Bucket::RelationEdge>,_std::allocator<dg::vr::Bucket::RelationEdge>_>
                ::find(&firstStrictEdges->_M_t,edge);
        if ((_Rb_tree_header *)cVar2._M_node ==
            &(firstStrictEdges->_M_t)._M_impl.super__Rb_tree_header) {
          return true;
        }
        std::bitset<12UL>::set(&updated->bits,(ulong)strictRel,false);
      }
      strictRel = dg::vr::Relations::getNonStrict(strictRel);
    }
    else {
      bVar3 = false;
    }
    std::bitset<12UL>::set(&updated->bits,(ulong)strictRel,!toFirstStrict);
  }
  return bVar3;
}

Assistant:

static bool processEdge(const Bucket::RelationEdge &edge,
                            Relations::Type strictRel, Relations &updated,
                            bool toFirstStrict,
                            const Bucket::iterator::Visited &firstStrictEdges) {
        if (!Relations::transitiveOver(strictRel,
                                       edge.rel())) // edge not relevant
            return true;
        if (!toFirstStrict) { // finding all strictly related
            updated.set(strictRel);
            return false;
        }
        // else unsetting all that are not really first strict

        bool targetOfFSE = updated.has(strictRel); // FSE = first strict edge

        if (!targetOfFSE) {
            updated.set(Relations::getNonStrict(strictRel), false);
            return false;
        }

        // else possible false strict
        bool thisIsFSE = firstStrictEdges.find(edge) != firstStrictEdges.end();

        if (thisIsFSE) { // strict relation set by false first strict
            updated.set(strictRel, false);
            updated.set(Relations::getNonStrict(strictRel), false);
        }
        return true; // skip because search will happen from target sooner or
                     // later
    }